

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

QRectF * __thiscall
QWidgetTextControlPrivate::cursorRectPlusUnicodeDirectionMarkers
          (QRectF *__return_storage_ptr__,QWidgetTextControlPrivate *this,QTextCursor *cursor)

{
  char cVar1;
  int position;
  long in_FS_OFFSET;
  QRectF local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QTextCursor::isNull();
  if (cVar1 == '\0') {
    position = QTextCursor::position();
    rectForPosition(&local_48,this,position);
    __return_storage_ptr__->xp = local_48.xp + -4.0;
    __return_storage_ptr__->yp = local_48.yp + 0.0;
    __return_storage_ptr__->w = local_48.w + 4.0 + 4.0;
    __return_storage_ptr__->h = local_48.h + 0.0;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0047bcfa;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0047bcfa:
      __stack_chk_fail();
    }
    __return_storage_ptr__->w = 0.0;
    __return_storage_ptr__->h = 0.0;
    __return_storage_ptr__->xp = 0.0;
    __return_storage_ptr__->yp = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QWidgetTextControlPrivate::cursorRectPlusUnicodeDirectionMarkers(const QTextCursor &cursor) const
{
    if (cursor.isNull())
        return QRectF();

    return rectForPosition(cursor.position()).adjusted(-4, 0, 4, 0);
}